

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindBinaryFloatingPoint<duckdb::ModuloOperator>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  byte bVar1;
  ClientConfig *pCVar2;
  NotImplementedException *this;
  PhysicalType type;
  uint uVar3;
  _Any_data *__return_storage_ptr__;
  allocator local_a9;
  _Any_data local_a8 [2];
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  string local_40;
  
  pCVar2 = ClientConfig::GetConfig((ClientContext *)bound_function);
  if (pCVar2->ieee_floating_point_ops != true) {
    __return_storage_ptr__ = local_a8;
    GetBinaryFunctionIgnoreZero<duckdb::ModuloOperator>
              ((scalar_function_t *)__return_storage_ptr__,
               *(PhysicalType *)
                ((long)&arguments[6].
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1));
    goto LAB_007b0fc5;
  }
  bVar1 = *(byte *)((long)&arguments[6].
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  if (bVar1 == 0xc) {
    local_a8[0]._0_8_ = ScalarFunction::BinaryFunction<double,double,double,duckdb::ModuloOperator>;
LAB_007b0ee5:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               local_68._M_pod_data,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_a8);
  }
  else {
    if (bVar1 == 0xb) {
      local_a8[0]._0_8_ = ScalarFunction::BinaryFunction<float,float,float,duckdb::ModuloOperator>;
      goto LAB_007b0ee5;
    }
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = 0;
    uStack_70 = 0;
    switch(bVar1) {
    case 2:
      local_a8[0]._0_8_ =
           ScalarFunction::
           BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::ModuloOperator>;
      break;
    case 3:
      local_a8[0]._0_8_ =
           ScalarFunction::
           BinaryFunction<signed_char,signed_char,signed_char,duckdb::ModuloOperator>;
      break;
    case 4:
      local_a8[0]._0_8_ =
           ScalarFunction::
           BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::ModuloOperator>;
      break;
    case 5:
      local_a8[0]._0_8_ = ScalarFunction::BinaryFunction<short,short,short,duckdb::ModuloOperator>;
      break;
    case 6:
      local_a8[0]._0_8_ =
           ScalarFunction::
           BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::ModuloOperator>;
      break;
    case 7:
      local_a8[0]._0_8_ = ScalarFunction::BinaryFunction<int,int,int,duckdb::ModuloOperator>;
      break;
    case 8:
      local_a8[0]._0_8_ =
           ScalarFunction::
           BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::ModuloOperator>;
      break;
    case 9:
      local_a8[0]._0_8_ = ScalarFunction::BinaryFunction<long,long,long,duckdb::ModuloOperator>;
      break;
    default:
      uVar3 = (uint)bVar1;
      if (uVar3 == 0xcb) {
        local_a8[0]._0_8_ =
             ScalarFunction::
             BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::ModuloOperator>
        ;
      }
      else {
        if (uVar3 != 0xcc) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_a8[0]._M_pod_data,
                     "Unimplemented type for GetScalarBinaryFunction: %s",&local_a9);
          TypeIdToString_abi_cxx11_(&local_40,(duckdb *)(ulong)uVar3,type);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)local_a8,&local_40);
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_a8[0]._0_8_ =
             ScalarFunction::
             BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ModuloOperator>
        ;
      }
    }
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               local_88._M_pod_data,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_a8);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_68,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_88);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_88);
  }
  __return_storage_ptr__ = &local_68;
LAB_007b0fc5:
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            &arguments[7].
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
            (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            __return_storage_ptr__);
  ::std::_Function_base::~_Function_base((_Function_base *)__return_storage_ptr__);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
}

Assistant:

unique_ptr<FunctionData> BindBinaryFloatingPoint(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	auto &config = ClientConfig::GetConfig(context);
	if (config.ieee_floating_point_ops) {
		bound_function.function = GetScalarBinaryFunction<OP>(bound_function.return_type.InternalType());
	} else {
		bound_function.function = GetBinaryFunctionIgnoreZero<OP>(bound_function.return_type.InternalType());
	}
	return nullptr;
}